

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTD_overflowCorrectIfNeeded
               (ZSTD_matchState_t *ms,ZSTD_cwksp *ws,ZSTD_CCtx_params *params,void *ip,void *iend)

{
  uint uVar1;
  U32 *table;
  U32 reducerValue;
  int iVar2;
  U32 UVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  U32 UVar7;
  
  if (0xe0000000 < (uint)((int)iend - *(int *)&(ms->window).base)) {
    reducerValue = ZSTD_window_correctOverflow
                             (&ms->window,
                              ((params->cParams).chainLog - 1) +
                              (uint)((params->cParams).strategy < ZSTD_btlazy2),
                              1 << ((byte)(params->cParams).windowLog & 0x1f),ip);
    ZSTD_cwksp_mark_tables_dirty(ws);
    ZSTD_reduceTable(ms->hashTable,1 << ((byte)(params->cParams).hashLog & 0x1f),reducerValue);
    iVar2 = ZSTD_allocateChainTable
                      ((params->cParams).strategy,params->useRowMatchFinder,ms->dedicatedDictSearch)
    ;
    if (iVar2 != 0) {
      uVar1 = (params->cParams).chainLog;
      UVar3 = 1 << ((byte)uVar1 & 0x1f);
      table = ms->chainTable;
      if ((params->cParams).strategy == ZSTD_btlazy2) {
        iVar2 = 0x10;
        if (uVar1 < 4) {
          __assert_fail("(size & (ZSTD_ROWSIZE-1)) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x5abc,
                        "void ZSTD_reduceTable_internal(U32 *const, const U32, const U32, const int)"
                       );
        }
        if (uVar1 == 0x1f) {
          __assert_fail("size < (1U<<31)",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x5abd,
                        "void ZSTD_reduceTable_internal(U32 *const, const U32, const U32, const int)"
                       );
        }
        iVar5 = 0;
        for (iVar4 = 0; iVar4 != (int)UVar3 / 0x10; iVar4 = iVar4 + 1) {
          for (lVar6 = (long)iVar5; iVar2 != lVar6; lVar6 = lVar6 + 1) {
            uVar1 = table[lVar6];
            UVar7 = uVar1 - reducerValue;
            if (uVar1 < reducerValue + 2) {
              UVar7 = 0;
            }
            if (uVar1 == 1) {
              UVar7 = 1;
            }
            table[lVar6] = UVar7;
          }
          iVar2 = iVar2 + 0x10;
          iVar5 = iVar5 + 0x10;
        }
      }
      else {
        ZSTD_reduceTable(table,UVar3,reducerValue);
      }
    }
    if (ms->hashLog3 != 0) {
      ZSTD_reduceTable(ms->hashTable3,1 << ((byte)ms->hashLog3 & 0x1f),reducerValue);
    }
    ZSTD_cwksp_mark_tables_clean(ws);
    UVar3 = ms->nextToUpdate - reducerValue;
    if (ms->nextToUpdate < reducerValue) {
      UVar3 = 0;
    }
    ms->nextToUpdate = UVar3;
    ms->loadedDictEnd = 0;
    ms->dictMatchState = (ZSTD_matchState_t *)0x0;
  }
  return;
}

Assistant:

static void ZSTD_overflowCorrectIfNeeded(ZSTD_matchState_t* ms,
                                         ZSTD_cwksp* ws,
                                         ZSTD_CCtx_params const* params,
                                         void const* ip,
                                         void const* iend)
{
    U32 const cycleLog = ZSTD_cycleLog(params->cParams.chainLog, params->cParams.strategy);
    U32 const maxDist = (U32)1 << params->cParams.windowLog;
    if (ZSTD_window_needOverflowCorrection(ms->window, cycleLog, maxDist, ms->loadedDictEnd, ip, iend)) {
        U32 const correction = ZSTD_window_correctOverflow(&ms->window, cycleLog, maxDist, ip);
        ZSTD_STATIC_ASSERT(ZSTD_CHAINLOG_MAX <= 30);
        ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX_32 <= 30);
        ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX <= 31);
        ZSTD_cwksp_mark_tables_dirty(ws);
        ZSTD_reduceIndex(ms, params, correction);
        ZSTD_cwksp_mark_tables_clean(ws);
        if (ms->nextToUpdate < correction) ms->nextToUpdate = 0;
        else ms->nextToUpdate -= correction;
        /* invalidate dictionaries on overflow correction */
        ms->loadedDictEnd = 0;
        ms->dictMatchState = NULL;
    }
}